

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5AtomicCountersArrayIndexing.cpp
# Opt level: O1

void __thiscall
glcts::GPUShader5AtomicCountersArrayIndexing::deinit(GPUShader5AtomicCountersArrayIndexing *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x92c0,0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_id = 0;
  }
  if (this->m_compute_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_compute_shader_id = 0;
  }
  if (this->m_buffer_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_buffer_id);
    this->m_buffer_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GPUShader5AtomicCountersArrayIndexing::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);
		m_program_id = 0;
	}

	if (m_compute_shader_id != 0)
	{
		gl.deleteShader(m_compute_shader_id);
		m_compute_shader_id = 0;
	}

	if (m_buffer_id != 0)
	{
		gl.deleteBuffers(1, &m_buffer_id);
		m_buffer_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}